

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void av1_build_obmc_inter_predictors_sb(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  uint8_t uVar1;
  int mi_row;
  int mi_col;
  int dst_stride2 [3];
  int dst_stride1 [3];
  int dst_width2 [3];
  uint8_t *dst_buf2 [3];
  int dst_height2 [3];
  int dst_height1 [3];
  int dst_width1 [3];
  uint8_t *dst_buf1 [3];
  int local_c8 [4];
  int local_b8 [4];
  int local_a8 [4];
  uint8_t *local_98 [4];
  int local_78 [4];
  int local_68 [4];
  int local_58 [4];
  uint8_t *local_48 [3];
  
  uVar1 = cm->seq_params->monochrome;
  local_b8[2] = 0x80;
  local_b8[0] = 0x80;
  local_b8[1] = 0x80;
  local_c8[2] = 0x80;
  local_c8[0] = 0x80;
  local_c8[1] = 0x80;
  local_58[2] = 0x80;
  local_58[0] = 0x80;
  local_58[1] = 0x80;
  local_a8[2] = 0x80;
  local_a8[0] = 0x80;
  local_a8[1] = 0x80;
  local_68[2] = 0x80;
  local_68[0] = 0x80;
  local_68[1] = 0x80;
  local_78[2] = 0x80;
  local_78[0] = 0x80;
  local_78[1] = 0x80;
  av1_setup_obmc_dst_bufs(xd,local_48,local_98);
  mi_row = xd->mi_row;
  mi_col = xd->mi_col;
  av1_build_prediction_by_above_preds(cm,xd,local_48,local_58,local_68,local_b8);
  av1_build_prediction_by_left_preds(cm,xd,local_98,local_a8,local_78,local_c8);
  av1_setup_dst_planes
            (xd->plane,(*xd->mi)->bsize,&cm->cur_frame->buf,mi_row,mi_col,0,
             (uint)(uVar1 == '\0') * 2 + 1);
  av1_build_obmc_inter_prediction(cm,xd,local_48,local_b8,local_98,local_c8);
  return;
}

Assistant:

void av1_build_obmc_inter_predictors_sb(const AV1_COMMON *cm, MACROBLOCKD *xd) {
  const int num_planes = av1_num_planes(cm);
  uint8_t *dst_buf1[MAX_MB_PLANE], *dst_buf2[MAX_MB_PLANE];
  int dst_stride1[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_stride2[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_width1[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_width2[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_height1[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };
  int dst_height2[MAX_MB_PLANE] = { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE };

  av1_setup_obmc_dst_bufs(xd, dst_buf1, dst_buf2);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  av1_build_prediction_by_above_preds(cm, xd, dst_buf1, dst_width1, dst_height1,
                                      dst_stride1);
  av1_build_prediction_by_left_preds(cm, xd, dst_buf2, dst_width2, dst_height2,
                                     dst_stride2);
  av1_setup_dst_planes(xd->plane, xd->mi[0]->bsize, &cm->cur_frame->buf, mi_row,
                       mi_col, 0, num_planes);
  av1_build_obmc_inter_prediction(cm, xd, dst_buf1, dst_stride1, dst_buf2,
                                  dst_stride2);
}